

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicAtomicCase3::Run(BasicAtomicCase3 *this)

{
  bool bVar1;
  long lVar2;
  uvec3 local_24;
  
  local_24.m_data[0] = 0x40;
  local_24.m_data[1] = 1;
  local_24.m_data[2] = 1;
  bVar1 = RunIteration(this,&local_24,false);
  lVar2 = -1;
  if (bVar1) {
    local_24.m_data._0_8_ = &DAT_100000001;
    local_24.m_data[2] = 0x40;
    bVar1 = RunIteration(this,&local_24,true);
    if (bVar1) {
      local_24.m_data._0_8_ = &DAT_100000001;
      local_24.m_data[2] = 4;
      bVar1 = RunIteration(this,&local_24,false);
      if (bVar1) {
        local_24.m_data[0] = 3;
        local_24.m_data[1] = 2;
        local_24.m_data[2] = 1;
        bVar1 = RunIteration(this,&local_24,true);
        if (bVar1) {
          local_24.m_data[0] = 2;
          local_24.m_data[1] = 4;
          local_24.m_data[2] = 2;
          bVar1 = RunIteration(this,&local_24,false);
          if (bVar1) {
            local_24.m_data[0] = 2;
            local_24.m_data[1] = 4;
            local_24.m_data[2] = 7;
            bVar1 = RunIteration(this,&local_24,true);
            lVar2 = (ulong)bVar1 - 1;
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), true))
			return ERROR;
		return NO_ERROR;
	}